

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-rbtree.c
# Opt level: O3

void test_empty(void)

{
  int iVar1;
  RBTREE_NODE *node;
  RBTREE tree;
  RBTREE local_30;
  
  local_30.root = (RBTREE_NODE *)0x0;
  iVar1 = rbtree_verify(&local_30);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x68,"%s","rbtree_verify(&tree) == 0");
  acutest_check_((uint)(local_30.root == (RBTREE_NODE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x69,"%s","rbtree_is_empty(&tree)");
  node = make_val(0x2a);
  iVar1 = rbtree_insert(&local_30,node,val_cmp);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x6a,"%s","rbtree_insert(&tree, make_val(42), val_cmp) == 0");
  iVar1 = rbtree_verify(&local_30);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x6b,"%s","rbtree_verify(&tree) == 0");
  acutest_check_((uint)(local_30.root != (RBTREE_NODE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x6c,"%s","!rbtree_is_empty(&tree)");
  clear_tree(&local_30);
  acutest_check_((uint)(local_30.root == (RBTREE_NODE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x6e,"%s","rbtree_is_empty(&tree)");
  return;
}

Assistant:

static void
test_empty(void)
{
    RBTREE tree = RBTREE_INITIALIZER;

    TEST_CHECK(rbtree_verify(&tree) == 0);
    TEST_CHECK(rbtree_is_empty(&tree));
    TEST_CHECK(rbtree_insert(&tree, make_val(42), val_cmp) == 0);
    TEST_CHECK(rbtree_verify(&tree) == 0);
    TEST_CHECK(!rbtree_is_empty(&tree));
    clear_tree(&tree);
    TEST_CHECK(rbtree_is_empty(&tree));
}